

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.h
# Opt level: O1

ChCoordsys<double> * __thiscall chrono::ChLinkRevolute::GetLinkRelativeCoords(ChLinkRevolute *this)

{
  ChCoordsys<double> *in_RDI;
  
  (in_RDI->pos).m_data[0] = (this->m_frame2).coord.pos.m_data[0];
  (in_RDI->pos).m_data[1] = (this->m_frame2).coord.pos.m_data[1];
  (in_RDI->pos).m_data[2] = (this->m_frame2).coord.pos.m_data[2];
  (in_RDI->rot).m_data[0] = (this->m_frame2).coord.rot.m_data[0];
  (in_RDI->rot).m_data[1] = (this->m_frame2).coord.rot.m_data[1];
  (in_RDI->rot).m_data[2] = (this->m_frame2).coord.rot.m_data[2];
  (in_RDI->rot).m_data[3] = (this->m_frame2).coord.rot.m_data[3];
  return in_RDI;
}

Assistant:

virtual ChCoordsys<> GetLinkRelativeCoords() override { return m_frame2.GetCoord(); }